

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::str<char_const(&)[35],kj::Exception_const&,char>
          (String *__return_storage_ptr__,kj *this,char (*params) [35],Exception *params_1,
          char *params_2)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 local_59 [9];
  undefined8 uStack_50;
  undefined8 *local_48;
  kj *local_38;
  size_t local_30;
  
  local_30 = strlen((char *)this);
  local_38 = this;
  operator*((ArrayPtr<const_char> *)(local_59 + 1),params);
  local_59[0] = *(undefined1 *)&(params_1->ownFile).content.ptr;
  _::concat<kj::ArrayPtr<char_const>,kj::String,kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,(_ *)&local_38,(ArrayPtr<const_char> *)(local_59 + 1),
             (String *)local_59,(FixedArray<char,_1UL> *)params_2);
  uVar2 = uStack_50;
  uVar1 = local_59._1_8_;
  if (local_59._1_8_ != 0) {
    local_59._1_8_ = 0;
    uStack_50 = 0;
    (**(code **)*local_48)(local_48,uVar1,1,uVar2,uVar2,0);
  }
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}